

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O2

long UnifInt(long nLow,long nHigh,long nStream)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = nHigh;
  if (nLow < nHigh) {
    lVar3 = nLow;
  }
  lVar2 = nLow - nHigh;
  if (nLow - nHigh == 0 || nLow < nHigh) {
    lVar2 = -(nLow - nHigh);
  }
  lVar4 = 0;
  if ((ulong)nStream < 0x32) {
    lVar4 = nStream;
  }
  lVar1 = NextRand(Seed[lVar4].value);
  Seed[lVar4].value = lVar1;
  return (long)(((double)lVar1 / 2147483647.0) * (double)(lVar2 + 1)) + lVar3;
}

Assistant:

long
UnifInt(long nLow, long nHigh, long nStream)

/*
 * Returns an integer uniformly distributed between nLow and nHigh, 
 * including * the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dRange;
    long            nTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;

    if (nLow > nHigh)
    {
        nTemp = nLow;
        nLow = nHigh;
        nHigh = nTemp;
    }

    dRange = (double) (nHigh - nLow + 1);
    Seed[nStream].value = NextRand(Seed[nStream].value);
    nTemp = (long) (((double) Seed[nStream].value / dM) * (dRange));
    return (nLow + nTemp);
}